

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::TriangleDraw::Run(TriangleDraw *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  bool *compile_error;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  Vector<float,_4> *this_01;
  ulong uVar6;
  allocator_type local_dd;
  GLuint l_vao;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> read;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLenum drawBuffer;
  Vector<float,_4> local_98;
  GLfloat buffData [16];
  GLfloat colorf [4];
  
  this_00 = &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->fbo);
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&this->rbo);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,this->rbo);
  glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8814,100,100);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,this->rbo);
  drawBuffer = 0x8ce0;
  glu::CallLogWrapper::glDrawBuffers(this_00,1,&drawBuffer);
  colorf[0] = 0.0;
  colorf[1] = 0.0;
  colorf[2] = 0.0;
  colorf[3] = 0.0;
  glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,colorf);
  glu::CallLogWrapper::glViewport(this_00,0,0,100,100);
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1a])
            (buffData,this);
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1b])
            (&data,this);
  GVar2 = TGBase::CreateProgram
                    ((TGBase *)this,(char *)buffData._0_8_,(char *)0x0,(char *)0x0,(char *)0x0,
                     (char *)data.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  this->program = GVar2;
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)buffData);
  glu::CallLogWrapper::glBindAttribLocation(this_00,this->program,0,"Vertex");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,this->program,0,"FragColor");
  glu::CallLogWrapper::glLinkProgram(this_00,this->program);
  bVar1 = TGBase::CheckProgram((TGBase *)this,this->program,compile_error);
  if (bVar1) {
    glu::CallLogWrapper::glUseProgram(this_00,this->program);
    glu::CallLogWrapper::glGenTextures(this_00,1,&(this->super_GatherBase).tex);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,(this->super_GatherBase).tex);
    buffData[0] = 0.25;
    buffData[1] = 0.5;
    buffData[2] = 0.75;
    buffData[3] = 1.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&data,10000,(value_type *)buffData,(allocator_type *)&read);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8814,100,100,0,0x1908,0x1406,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x8072,0x812f);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&l_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,l_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->vbo);
    buffData[0xc] = 1.0;
    buffData[0xd] = -1.0;
    buffData[0xe] = 0.0;
    buffData[0xf] = 1.0;
    buffData[8] = 1.0;
    buffData[9] = 1.0;
    buffData[10] = 0.0;
    buffData[0xb] = 1.0;
    buffData[4] = -1.0;
    buffData[5] = -1.0;
    buffData[6] = 0.0;
    buffData[7] = 1.0;
    buffData[0] = -1.0;
    buffData[1] = 1.0;
    buffData[2] = 0.0;
    buffData[3] = 1.0;
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x40,buffData,0x88e4);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&l_vao);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
    tcu::Vector<float,_4>::Vector(&local_98,0.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&read,10000,&local_98,&local_dd);
    uVar4 = 0;
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,100,100,0x1908,0x1406,
               read.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    do {
      uVar6 = (ulong)uVar4;
      uVar5 = (long)read.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)read.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (uVar5 <= uVar6) goto LAB_009ab375;
      this_01 = read.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar6;
      tcu::Vector<float,_4>::Vector(&local_98,0.75);
      bVar1 = tcu::Vector<float,_4>::operator!=(this_01,&local_98);
      uVar4 = uVar4 + 1;
    } while (!bVar1);
    anon_unknown_0::Output
              ("Got: %f %f %f %f, expected vec4(0.25)",
               SUB84((double)read.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar6].m_data[0],0),
               (double)read.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6].m_data[1],
               (double)read.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6].m_data[2],
               (double)read.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6].m_data[3]);
LAB_009ab375:
    lVar3 = -(ulong)(uVar6 < uVar5);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&read.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  else {
    lVar3 = -1;
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);
		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA32F, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		GLenum drawBuffer = GL_COLOR_ATTACHMENT0;
		glDrawBuffers(1, &drawBuffer);
		GLfloat colorf[4] = { 0, 0, 0, 0 };
		glClearBufferfv(GL_COLOR, 0, colorf);
		glViewport(0, 0, 100, 100);

		program = CreateProgram(VertexShader().c_str(), NULL, NULL, NULL, FragmentShader().c_str());
		glBindAttribLocation(program, 0, "Vertex");
		glBindFragDataLocation(program, 0, "FragColor");
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		glUseProgram(program);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		std::vector<Vec4> data(100 * 100, Vec4(0.25, 0.5, 0.75, 1));
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 100, 100, 0, GL_RGBA, GL_FLOAT, &data[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		GLuint l_vao;
		glGenVertexArrays(1, &l_vao);
		glBindVertexArray(l_vao);
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		GLfloat buffData[16] = { -1, 1, 0, 1, -1, -1, 0, 1, 1, 1, 0, 1, 1, -1, 0, 1 };
		glBufferData(GL_ARRAY_BUFFER, sizeof(buffData), buffData, GL_STATIC_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(GLfloat) * 4, 0);
		glEnableVertexAttribArray(0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glDisableVertexAttribArray(0);
		glDeleteVertexArrays(1, &l_vao);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glReadBuffer(GL_COLOR_ATTACHMENT0);
		std::vector<Vec4> read(100 * 100, Vec4(0));
		glReadPixels(0, 0, 100, 100, GL_RGBA, GL_FLOAT, &read[0]);
		for (unsigned int i = 0; i < read.size(); ++i)
		{
			if (read[i] != Vec4(0.75))
			{
				Output("Got: %f %f %f %f, expected vec4(0.25)", read[i].x(), read[i].y(), read[i].z(), read[i].w());
				return ERROR;
			}
		}

		return NO_ERROR;
	}